

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O1

bool anon_unknown.dwarf_983603::AnyTargetCommandOutputMatches
               (string *name,vector<cmCustomCommand,_std::allocator<cmCustomCommand>_> *commands)

{
  cmCustomCommand *pcVar1;
  bool bVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar3;
  cmCustomCommand *this;
  long lVar4;
  cmCustomCommand *pcVar5;
  
  this = (commands->super__Vector_base<cmCustomCommand,_std::allocator<cmCustomCommand>_>)._M_impl.
         super__Vector_impl_data._M_start;
  pcVar1 = (commands->super__Vector_base<cmCustomCommand,_std::allocator<cmCustomCommand>_>)._M_impl
           .super__Vector_impl_data._M_finish;
  lVar4 = ((long)pcVar1 - (long)this >> 3) * 0x6f96f96f96f96f97 >> 2;
  if (0 < lVar4) {
    lVar4 = lVar4 + 1;
    do {
      pvVar3 = cmCustomCommand::GetByproducts_abi_cxx11_(this);
      bVar2 = AnyOutputMatches(name,pvVar3);
      pcVar5 = this;
      if (bVar2) goto LAB_0028df32;
      pvVar3 = cmCustomCommand::GetByproducts_abi_cxx11_(this + 1);
      bVar2 = AnyOutputMatches(name,pvVar3);
      pcVar5 = this + 1;
      if (bVar2) goto LAB_0028df32;
      pvVar3 = cmCustomCommand::GetByproducts_abi_cxx11_(this + 2);
      bVar2 = AnyOutputMatches(name,pvVar3);
      pcVar5 = this + 2;
      if (bVar2) goto LAB_0028df32;
      pvVar3 = cmCustomCommand::GetByproducts_abi_cxx11_(this + 3);
      bVar2 = AnyOutputMatches(name,pvVar3);
      pcVar5 = this + 3;
      if (bVar2) goto LAB_0028df32;
      this = this + 4;
      lVar4 = lVar4 + -1;
    } while (1 < lVar4);
  }
  lVar4 = ((long)pcVar1 - (long)this >> 3) * 0x6f96f96f96f96f97;
  if (lVar4 != 1) {
    if (lVar4 != 2) {
      pcVar5 = pcVar1;
      if (lVar4 != 3) goto LAB_0028df32;
      pvVar3 = cmCustomCommand::GetByproducts_abi_cxx11_(this);
      bVar2 = AnyOutputMatches(name,pvVar3);
      pcVar5 = this;
      if (bVar2) goto LAB_0028df32;
      this = this + 1;
    }
    pvVar3 = cmCustomCommand::GetByproducts_abi_cxx11_(this);
    bVar2 = AnyOutputMatches(name,pvVar3);
    pcVar5 = this;
    if (bVar2) goto LAB_0028df32;
    this = this + 1;
  }
  pvVar3 = cmCustomCommand::GetByproducts_abi_cxx11_(this);
  bVar2 = AnyOutputMatches(name,pvVar3);
  pcVar5 = this;
  if (!bVar2) {
    pcVar5 = pcVar1;
  }
LAB_0028df32:
  return pcVar5 != pcVar1;
}

Assistant:

bool AnyTargetCommandOutputMatches(
  const std::string& name, const std::vector<cmCustomCommand>& commands)
{
  return std::any_of(commands.begin(), commands.end(),
                     [&name](cmCustomCommand const& command) -> bool {
                       return AnyOutputMatches(name, command.GetByproducts());
                     });
}